

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool parse_vrp_file(Instance *instance,FILE *filehandle,char *filepath)

{
  bool bVar1;
  _Bool _Var2;
  char cVar3;
  int iVar4;
  size_t __n;
  char *__ptr;
  size_t sVar5;
  double *pdVar6;
  bool bVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  int32_t dim;
  anon_struct_24_4_1626e806 sections [5];
  double local_e8;
  VrplibParser local_e0;
  char *local_b0;
  char *local_a8;
  code *local_a0;
  char local_98 [8];
  char *local_90;
  code *local_88;
  undefined2 local_80;
  char *local_78;
  code *local_70;
  undefined2 local_68;
  char *local_60;
  code *local_58;
  undefined2 local_50;
  char *local_48;
  code *local_40;
  undefined1 local_38;
  undefined1 local_37;
  
  fseek((FILE *)filehandle,0,2);
  __n = ftell((FILE *)filehandle);
  fseek((FILE *)filehandle,0,0);
  __ptr = (char *)malloc(__n + 1);
  if (__ptr == (char *)0x0) {
    return false;
  }
  sVar5 = fread(__ptr,1,__n,(FILE *)filehandle);
  _Var2 = false;
  if (sVar5 != __n) goto LAB_00103dd7;
  __ptr[__n] = '\0';
  local_e0.curline = 0;
  local_e0._28_4_ = 0;
  local_e0._40_8_ = 0;
  bVar12 = true;
  bVar1 = false;
  local_e0.filename = filepath;
  local_e0.base = __ptr;
  local_e0.at = __ptr;
  local_e0.size = __n;
  do {
    if ((bVar1) || ((long)local_e0.base - (long)local_e0.at == -local_e0.size)) break;
    parser_eat_all_blanks(&local_e0);
    _Var2 = parser_match_string(&local_e0,"#");
    if (_Var2) {
      for (; (((long)local_e0.base - (long)local_e0.at != -local_e0.size && (*local_e0.at != '\n'))
             && (*local_e0.at != '\r'));
          local_e0.at = local_e0.at + ((long)local_e0.base - (long)local_e0.at != -local_e0.size)) {
      }
      parser_eat_newline(&local_e0);
      bVar1 = false;
      lVar8 = -local_e0.size;
      lVar11 = (long)local_e0.base - (long)local_e0.at;
      if (lVar11 != lVar8) {
        do {
          if ((*local_e0.at != ' ') && (*local_e0.at != '\t')) break;
          local_e0.at = local_e0.at + (lVar11 != lVar8);
          lVar11 = (long)local_e0.base - (long)local_e0.at;
        } while (lVar11 != lVar8);
        goto LAB_001039e6;
      }
    }
    else {
      pcVar10 = parse_hdr_field(&local_e0,"NAME");
      if (pcVar10 == (char *)0x0) {
        pcVar10 = parse_hdr_field(&local_e0,"COMMENT");
        if (pcVar10 == (char *)0x0) {
          pcVar10 = parse_hdr_field(&local_e0,"TYPE");
          if (pcVar10 == (char *)0x0) {
            pcVar10 = parse_hdr_field(&local_e0,"DIMENSION");
            if (pcVar10 == (char *)0x0) {
              pcVar10 = parse_hdr_field(&local_e0,"VEHICLES");
              if (pcVar10 == (char *)0x0) {
                pcVar10 = parse_hdr_field(&local_e0,"EDGE_WEIGHT_TYPE");
                if (pcVar10 == (char *)0x0) {
                  pcVar10 = parse_hdr_field(&local_e0,"EDGE_WEIGHT_FORMAT");
                  if (pcVar10 == (char *)0x0) {
                    pcVar10 = parse_hdr_field(&local_e0,"CAPACITY");
                    if (pcVar10 == (char *)0x0) {
                      bVar1 = true;
                      goto LAB_001039e8;
                    }
                    local_e8 = 0.0;
                    _Var2 = str_to_double(pcVar10,&local_e8);
                    if (!_Var2) {
                      bVar12 = false;
                      parse_error(&local_e0,
                                  "expected valid number for CAPACITY field. Got `%s` instead",
                                  pcVar10);
                    }
                    dVar13 = local_e8;
                    if (local_e8 <= 0.0) {
                      dVar13 = 0.0;
                    }
                    instance->vehicle_cap = dVar13;
                  }
                  else {
                    iVar4 = strcmp(pcVar10,"FUNCTION");
                    if (iVar4 == 0) {
                      local_e0._40_8_ = local_e0._40_8_ & 0xffffffff00000000;
                    }
                    else {
                      iVar4 = strcmp(pcVar10,"UPPER_ROW");
                      if (iVar4 != 0) {
                        pcVar9 = "unsupported format `%s` for EDGE_WEIGHT_FORMAT";
                        goto LAB_001038b6;
                      }
                      local_e0.edgew_format = 1;
                    }
                  }
                }
                else {
                  lVar8 = 0;
                  bVar1 = true;
                  local_b0 = __ptr;
                  do {
                    bVar7 = bVar1;
                    iVar4 = strcmp(pcVar10,SUPPORTED_EDGEW[lVar8].name);
                    if (iVar4 == 0) {
                      local_e0.edgew_format = SUPPORTED_EDGEW[lVar8].fmt;
                      __ptr = local_b0;
                      goto LAB_001039de;
                    }
                    lVar8 = 1;
                    bVar1 = false;
                  } while (bVar7);
                  bVar12 = false;
                  parse_error(&local_e0,"Found unsupported EDGE_WEIGHT_TYPE (`%s`)",pcVar10);
                  __ptr = local_b0;
                }
              }
              else {
                local_e8 = (double)((ulong)local_e8 & 0xffffffff00000000);
                _Var2 = str_to_int32(pcVar10,(int32_t *)&local_e8);
                if (!_Var2) {
                  bVar12 = false;
                  parse_error(&local_e0,
                              "expected valid integer for VEHICLES field. Got `%s` instead",pcVar10)
                  ;
                }
                iVar4 = local_e8._0_4_;
                if (local_e8._0_4_ < 1) {
                  iVar4 = 0;
                }
                instance->num_vehicles = iVar4;
              }
            }
            else {
              local_e8 = (double)((ulong)local_e8 & 0xffffffff00000000);
              _Var2 = str_to_int32(pcVar10,(int32_t *)&local_e8);
              if (!_Var2) {
                bVar12 = false;
                parse_error(&local_e0,"expected valid integer for DIMENSION field. Got `%s` instead"
                            ,pcVar10);
              }
              iVar4 = local_e8._0_4_;
              if (local_e8._0_4_ < 2) {
                iVar4 = 1;
              }
              instance->num_customers = iVar4 + -1;
            }
          }
          else {
            iVar4 = strcmp(pcVar10,"CVRP");
            if (iVar4 != 0) {
              pcVar9 = "only CVRP type is supported. Found `%s` instead";
LAB_001038b6:
              bVar12 = false;
              parse_error(&local_e0,pcVar9,pcVar10);
            }
          }
        }
        else {
          pcVar9 = strdup(pcVar10);
          instance->comment = pcVar9;
        }
      }
      else {
        instance_set_name(instance,pcVar10);
      }
LAB_001039de:
      free(pcVar10);
LAB_001039e6:
      bVar1 = false;
    }
LAB_001039e8:
  } while (bVar12);
  if (bVar12) {
    if (instance->num_customers < 1) {
      pcVar10 = "couldn\'t deduce number of customers after parsing the VRPLIB header";
    }
    else {
      if (0.0 < instance->vehicle_cap) {
        _Var2 = prep_memory(instance);
        if (_Var2) {
          bVar12 = local_e0.edgew_format == EDGE_WEIGHT_FORMAT_EXPLICIT;
          if (bVar12) {
            pdVar6 = (double *)
                     malloc((long)(((instance->num_customers + 1) * instance->num_customers) / 2) <<
                            3);
            instance->edge_weight = pdVar6;
            if (pdVar6 == (double *)0x0) {
              iVar4 = 0x2c9;
              goto LAB_00103cd8;
            }
          }
          local_a8 = "NODE_COORD_SECTION";
          local_a0 = parse_vrplib_nodecoord_section;
          local_98[0] = '\x01';
          local_98[1] = '\0';
          local_90 = "DEMAND_SECTION";
          local_88 = parse_vrplib_demand_section;
          local_80 = 1;
          local_78 = "DEPOT_SECTION";
          local_70 = parse_vrplib_depot_section;
          local_68 = 1;
          local_60 = "PROFIT_SECTION";
          local_58 = parse_vrplib_profit_section;
          local_50 = 0;
          local_48 = "EDGE_WEIGHT_SECTION";
          local_40 = parse_vrplib_edge_weight_section;
          local_37 = 0;
          local_38 = bVar12;
          do {
            if ((local_e0.base + (local_e0.size - (long)local_e0.at) == (char *)0x0) ||
               (_Var2 = parser_match_string(&local_e0,"EOF"), _Var2)) {
              parser_eat_all_blanks(&local_e0);
              if (local_e0.base + (local_e0.size - (long)local_e0.at) == (char *)0x0) {
                lVar8 = 0;
                goto LAB_00103d05;
              }
              pcVar10 = "Found premature `EOF` while more input is still available";
              goto LAB_00103dc8;
            }
            lVar8 = 0;
            while( true ) {
              pcVar10 = *(char **)((long)&local_a8 + lVar8);
              _Var2 = parser_match_string(&local_e0,pcVar10);
              if ((_Var2) && (_Var2 = parser_match_newline(&local_e0), _Var2)) break;
              lVar8 = lVar8 + 0x18;
              if (lVar8 == 0x78) goto LAB_00103dc1;
            }
            if (local_98[lVar8 + 1] == '\x01') {
              parse_error(&local_e0,"Multiple definitions for section `%s`",pcVar10);
LAB_00103dc1:
              pcVar10 = "invalid input";
              goto LAB_00103dc8;
            }
            local_98[lVar8 + 1] = '\x01';
            cVar3 = (**(code **)((long)&local_a0 + lVar8))(&local_e0,instance);
          } while (cVar3 != '\0');
          pcVar9 = "Failure while parsing section `%s`";
LAB_00103da2:
          _Var2 = false;
          parse_error(&local_e0,pcVar9,pcVar10);
        }
        else {
          iVar4 = 0x2bd;
LAB_00103cd8:
          _Var2 = false;
          log_log(0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                  ,iVar4,"Failed to prepare memory for storing instance");
        }
        goto LAB_00103dd7;
      }
      pcVar10 = "couldn\'t deduce vehicle capacity after parsing the VRPLIB header";
    }
LAB_00103dc8:
    _Var2 = false;
    parse_error(&local_e0,pcVar10);
    goto LAB_00103dd7;
  }
  goto LAB_00103d4b;
  while (lVar8 = lVar8 + 0x18, lVar8 != 0x78) {
LAB_00103d05:
    if ((local_98[lVar8] == '\x01') && (local_98[lVar8 + 1] != '\x01')) {
      pcVar10 = *(char **)((long)&local_a8 + lVar8);
      pcVar9 = "Required section `%s` was not found";
      goto LAB_00103da2;
    }
  }
  _Var2 = true;
  if ((*instance->demands == 0.0) && (!NAN(*instance->demands))) goto LAB_00103dd7;
  parse_error(&local_e0,"demand for the depot node should be `0`. Got `%f` instead");
LAB_00103d4b:
  _Var2 = false;
LAB_00103dd7:
  free(__ptr);
  return _Var2;
}

Assistant:

bool parse_vrp_file(Instance *instance, FILE *filehandle,
                    const char *filepath) {

    bool result = true;
    size_t filesize = get_file_size(filehandle);

    // + 1 for null termination
    char *buffer = malloc(filesize + 1);
    if (!buffer) {
        result = false;
        goto terminate;
    }

    size_t readamt = fread(buffer, 1, filesize, filehandle);
    if (readamt != filesize) {
        result = false;
        goto terminate;
    }

    // NULL terminate the buffer
    buffer[filesize] = 0;
    VrplibParser parser = {0};
    parser.filename = filepath;
    parser.base = buffer;
    parser.at = buffer;
    parser.size = filesize;

    // First extract the header information
    if (!parse_vrplib_hdr(&parser, instance)) {
        result = false;
        goto terminate;
    }

    if (instance->num_customers <= 0) {
        parse_error(&parser, "couldn't deduce number of customers after "
                             "parsing the VRPLIB header");
        result = false;
        goto terminate;
    } else if (instance->vehicle_cap <= 0.0) {
        parse_error(&parser, "couldn't deduce vehicle capacity after "
                             "parsing the VRPLIB header");
        result = false;
        goto terminate;
    }

    if (!prep_memory(instance)) {
        log_fatal("Failed to prepare memory for storing instance");
        result = false;
        goto terminate;
    }

    bool needs_edge_section = parser_needs_edge_section(&parser);

    if (needs_edge_section) {
        instance->edge_weight =
            malloc(hm_nentries(1 + instance->num_customers) *
                   sizeof(*instance->edge_weight));
        if (!instance->edge_weight) {
            log_fatal("Failed to prepare memory for storing instance");
            result = false;
            goto terminate;
        }
    }

    struct {
        char *name;
        bool (*parse_fn)(VrplibParser *p, Instance *instance);
        bool required;
        bool found;
    } sections[] = {
        {"NODE_COORD_SECTION", parse_vrplib_nodecoord_section, 1, 0},
        {"DEMAND_SECTION", parse_vrplib_demand_section, 1, 0},
        {"DEPOT_SECTION", parse_vrplib_depot_section, 1, 0},
        {"PROFIT_SECTION", parse_vrplib_profit_section, 0, 0},
        {"EDGE_WEIGHT_SECTION", parse_vrplib_edge_weight_section,
         needs_edge_section, 0},
    };

    while (result) {
        bool done =
            parser_is_eof(&parser) || parser_match_string(&parser, "EOF");
        if (done) {
            break;
        }

        bool found_matching_section = false;
        for (int32_t secid = 0; secid < ARRAY_LEN_i32(sections); secid++) {
            if (parser_match_string(&parser, sections[secid].name) &&
                parser_match_newline(&parser)) {
                if (sections[secid].found) {
                    parse_error(&parser,
                                "Multiple definitions for section `%s`",
                                sections[secid].name);
                    result = false;
                    break;
                }

                sections[secid].found = true;
                found_matching_section = true;
                result = sections[secid].parse_fn(&parser, instance);
                if (!result) {
                    parse_error(&parser, "Failure while parsing section `%s`",
                                sections[secid].name);
                    result = false;
                }
                break;
            }
        }
        if (!found_matching_section) {
            parse_error(&parser, "invalid input");
            result = false;
        }
    }

    if (result) {

        // Keep eating whitespaces and newlines while there are any
        parser_eat_all_blanks(&parser);

        if (parser_remainder_size(&parser) != 0) {
            parse_error(&parser, "Found premature `EOF` while more input "
                                 "is still available");
            result = false;
            goto terminate;
        }

        for (int32_t secid = 0; secid < ARRAY_LEN_i32(sections); secid++) {
            if (sections[secid].required && !sections[secid].found) {
                parse_error(&parser, "Required section `%s` was not found",
                            sections[secid].name);
                result = false;
                goto terminate;
            }
        }

        if (instance->demands[0] != 0) {
            parse_error(
                &parser,
                "demand for the depot node should be `0`. Got `%f` instead",
                instance->demands[0]);
            result = false;
            goto terminate;
        }
    }

terminate:
    if (buffer) {
        free(buffer);
    }
    return result;
}